

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_bct64(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict12 *tcg_ctx;
  DisasJumpType DVar3;
  int imm;
  DisasCompare_conflict2 local_48;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 & 1) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar2 = (s->fields).c[0];
    imm = 0;
    if ((uVar1 >> 0x12 & 1) != 0) {
      imm = (s->fields).c[1];
    }
    local_48._0_1_ = 9;
    local_48.is_64 = true;
    local_48.g1 = true;
    local_48.g2 = false;
    tcg_gen_subi_i64_s390x(tcg_ctx,tcg_ctx->regs[iVar2],tcg_ctx->regs[iVar2],1);
    local_48.u.s64.a = tcg_ctx->regs[iVar2];
    local_48.u.s64.b = tcg_const_i64_s390x(tcg_ctx,0);
    DVar3 = help_branch(s,&local_48,(_Bool)((byte)(uVar1 >> 0x12) & 1),imm,o->in2);
    return DVar3;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_bct64(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    bool is_imm = have_field(s, i2);
    int imm = is_imm ? get_field(s, i2) : 0;
    DisasCompare c;

    c.cond = TCG_COND_NE;
    c.is_64 = true;
    c.g1 = true;
    c.g2 = false;

    tcg_gen_subi_i64(tcg_ctx, tcg_ctx->regs[r1], tcg_ctx->regs[r1], 1);
    c.u.s64.a = tcg_ctx->regs[r1];
    c.u.s64.b = tcg_const_i64(tcg_ctx, 0);

    return help_branch(s, &c, is_imm, imm, o->in2);
}